

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impbot.cpp
# Opt level: O2

void __thiscall impbot::read_handler(impbot *this,string *message)

{
  pointer pfVar1;
  pointer __x;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  func;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_40;
  
  pfVar1 = (this->read_handlers).
           super__Vector_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->read_handlers).
             super__Vector_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pfVar1; __x = __x + 1) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_40,__x);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&local_40,message);
    std::_Function_base::~_Function_base(&local_40.super__Function_base);
  }
  return;
}

Assistant:

void impbot::read_handler(const std::string &message)
{
    for (auto func : read_handlers)
        func(message);
}